

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

TextureCubemap * LoadTextureCubemap(TextureCubemap *__return_storage_ptr__,Image image,int layout)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int width;
  Image IVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  Rectangle srcRec;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int local_c8;
  int i_3;
  void *local_b8;
  int local_b0;
  int iStack_ac;
  int local_a4;
  int local_a0;
  int i_2;
  int i_1;
  float local_94;
  float fStack_90;
  int local_8c;
  float local_88;
  int i;
  Rectangle faceRecs [6];
  Image faces;
  int size;
  int layout_local;
  
  IVar5 = image;
  memset(__return_storage_ptr__,0,0x14);
  faces.format = layout;
  if (layout == 0) {
    if (image.height < image.width) {
      if (image.width / 6 == image.height) {
        faces.format = 2;
        __return_storage_ptr__->width = image.width / 6;
      }
      else {
        in_stack_ffffffffffffff04 = image.width / 4;
        if (in_stack_ffffffffffffff04 == image.height / 3) {
          faces.format = 4;
          __return_storage_ptr__->width = image.width / 4;
        }
        else if ((int)((float)image.height * 1.85) <= image.width) {
          faces.format = 5;
          __return_storage_ptr__->width = image.width / 4;
        }
      }
    }
    else if (image.width < image.height) {
      if (image.height / 6 == image.width) {
        faces.format = 1;
        __return_storage_ptr__->width = image.height / 6;
      }
      else {
        in_stack_ffffffffffffff00 = image.width / 3;
        if (in_stack_ffffffffffffff00 == image.height / 4) {
          faces.format = 3;
          __return_storage_ptr__->width = image.width / 3;
        }
      }
    }
    __return_storage_ptr__->height = __return_storage_ptr__->width;
  }
  if (faces.format == 0) {
    TraceLog(4,"IMAGE: Failed to detect cubemap image layout");
  }
  else {
    width = __return_storage_ptr__->width;
    memset(&faceRecs[5].width,0,0x18);
    memset(&local_88,0,0x60);
    for (local_8c = 0; local_8c < 6; local_8c = local_8c + 1) {
      i_2 = 0;
      i_1 = 0;
      local_94 = (float)width;
      fStack_90 = (float)width;
      faceRecs[(long)local_8c + -1].width = 0.0;
      faceRecs[(long)local_8c + -1].height = 0.0;
      faceRecs[local_8c].x = local_94;
      faceRecs[local_8c].y = fStack_90;
    }
    if (faces.format == 1) {
      faceRecs[5]._8_8_ = image.data;
      faces.data = (void *)image._8_8_;
      faces.width = image.mipmaps;
      faces.height = image.format;
      for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
        faceRecs[(long)local_a0 + -1].height = (float)width * (float)local_a0;
      }
    }
    else if (faces.format != 5) {
      if (faces.format == 2) {
        for (local_a4 = 0; local_a4 < 6; local_a4 = local_a4 + 1) {
          faceRecs[(long)local_a4 + -1].width = (float)width * (float)local_a4;
        }
      }
      else if (faces.format == 3) {
        local_88 = (float)width;
        i = (int)(float)width;
        faceRecs[0].width = (float)width;
        faceRecs[0].height = (float)width * 3.0;
        faceRecs[1].width = (float)width;
        faceRecs[1].height = 0.0;
        faceRecs[2].width = (float)width;
        faceRecs[2].height = (float)width * 2.0;
        faceRecs[3].width = 0.0;
        faceRecs[3].height = (float)width;
        faceRecs[4].width = (float)width * 2.0;
        faceRecs[4].height = (float)width;
      }
      else if (faces.format == 4) {
        local_88 = (float)width * 2.0;
        i = (int)(float)width;
        faceRecs[0].width = 0.0;
        faceRecs[0].height = (float)width;
        faceRecs[1].width = (float)width;
        faceRecs[1].height = 0.0;
        faceRecs[2].width = (float)width;
        faceRecs[2].height = (float)width * 2.0;
        faceRecs[3].width = (float)width;
        faceRecs[3].height = (float)width;
        faceRecs[4].width = (float)width * 3.0;
        faceRecs[4].height = (float)width;
      }
      GenImageColor((Image *)&i_3,width,width * 6,(Color)0xffff00ff);
      faceRecs[5]._8_8_ = _i_3;
      faces.data = local_b8;
      faces.width = local_b0;
      faces.height = iStack_ac;
      ImageFormat((Image *)&faceRecs[5].width,image.format);
    }
    for (local_c8 = 0; local_c8 < 6; local_c8 = local_c8 + 1) {
      uVar1 = faceRecs[(long)local_c8 + -1].width;
      uVar3 = faceRecs[(long)local_c8 + -1].height;
      srcRec.y = (float)uVar3;
      srcRec.x = (float)uVar1;
      uVar2 = faceRecs[local_c8].x;
      uVar4 = faceRecs[local_c8].y;
      srcRec.height = (float)uVar4;
      srcRec.width = (float)uVar2;
      auVar6._4_4_ = (float)width;
      auVar6._0_4_ = (float)width * (float)local_c8;
      auVar6._8_4_ = (float)width;
      auVar6._12_4_ = 0;
      ImageDraw((Image *)&faceRecs[5].width,IVar5,srcRec,(Rectangle)(auVar6 << 0x20),
                (Color)0xffffffff);
    }
    uVar7 = rlLoadTextureCubemap((void *)faceRecs[5]._8_8_,width,faces.height);
    __return_storage_ptr__->id = uVar7;
    if (__return_storage_ptr__->id == 0) {
      TraceLog(4,"IMAGE: Failed to load cubemap image");
    }
    IVar5.width = faces.width;
    IVar5.height = faces.height;
    IVar5.data = faces.data;
    IVar5.mipmaps = in_stack_ffffffffffffff00;
    IVar5.format = in_stack_ffffffffffffff04;
    UnloadImage(IVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

TextureCubemap LoadTextureCubemap(Image image, int layout)
{
    TextureCubemap cubemap = { 0 };

    if (layout == CUBEMAP_LAYOUT_AUTO_DETECT)      // Try to automatically guess layout type
    {
        // Check image width/height to determine the type of cubemap provided
        if (image.width > image.height)
        {
            if ((image.width/6) == image.height) { layout = CUBEMAP_LAYOUT_LINE_HORIZONTAL; cubemap.width = image.width/6; }
            else if ((image.width/4) == (image.height/3)) { layout = CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE; cubemap.width = image.width/4; }
            else if (image.width >= (int)((float)image.height*1.85f)) { layout = CUBEMAP_LAYOUT_PANORAMA; cubemap.width = image.width/4; }
        }
        else if (image.height > image.width)
        {
            if ((image.height/6) == image.width) { layout = CUBEMAP_LAYOUT_LINE_VERTICAL; cubemap.width = image.height/6; }
            else if ((image.width/3) == (image.height/4)) { layout = CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR; cubemap.width = image.width/3; }
        }

        cubemap.height = cubemap.width;
    }

    if (layout != CUBEMAP_LAYOUT_AUTO_DETECT)
    {
        int size = cubemap.width;

        Image faces = { 0 };                // Vertical column image
        Rectangle faceRecs[6] = { 0 };      // Face source rectangles
        for (int i = 0; i < 6; i++) faceRecs[i] = (Rectangle){ 0, 0, (float)size, (float)size };

        if (layout == CUBEMAP_LAYOUT_LINE_VERTICAL)
        {
            faces = image;
            for (int i = 0; i < 6; i++) faceRecs[i].y = (float)size*i;
        }
        else if (layout == CUBEMAP_LAYOUT_PANORAMA)
        {
            // TODO: Convert panorama image to square faces...
            // Ref: https://github.com/denivip/panorama/blob/master/panorama.cpp
        }
        else
        {
            if (layout == CUBEMAP_LAYOUT_LINE_HORIZONTAL) for (int i = 0; i < 6; i++) faceRecs[i].x = (float)size*i;
            else if (layout == CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR)
            {
                faceRecs[0].x = (float)size; faceRecs[0].y = (float)size;
                faceRecs[1].x = (float)size; faceRecs[1].y = (float)size*3;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = 0; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*2; faceRecs[5].y = (float)size;
            }
            else if (layout == CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE)
            {
                faceRecs[0].x = (float)size*2; faceRecs[0].y = (float)size;
                faceRecs[1].x = 0; faceRecs[1].y = (float)size;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = (float)size; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*3; faceRecs[5].y = (float)size;
            }

            // Convert image data to 6 faces in a vertical column, that's the optimum layout for loading
            faces = GenImageColor(size, size*6, MAGENTA);
            ImageFormat(&faces, image.format);

            // TODO: Image formating does not work with compressed textures!
        }

        for (int i = 0; i < 6; i++) ImageDraw(&faces, image, faceRecs[i], (Rectangle){ 0, (float)size*i, (float)size, (float)size }, WHITE);

        cubemap.id = rlLoadTextureCubemap(faces.data, size, faces.format);
        if (cubemap.id == 0) TRACELOG(LOG_WARNING, "IMAGE: Failed to load cubemap image");

        UnloadImage(faces);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Failed to detect cubemap image layout");

    return cubemap;
}